

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

void __thiscall wasm::TranslateToFuzzReader::fixAfterChanges::Fixer::replace(Fixer *this)

{
  Function *func;
  Expression *replacement;
  Expression **ppEVar1;
  
  replacement = makeTrivial(this->parent,
                            (Type)((*(this->
                                     super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                                     ).
                                     super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                                     .
                                     super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                                     .replacep)->type).id);
  func = (this->super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>).
         super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
         super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.currFunction;
  if (func != (Function *)0x0) {
    debuginfo::copyOriginalToReplacement
              (*(this->
                super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>).
                super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
                super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.replacep,
               replacement,func);
  }
  *(this->super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>).
   super_PostWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.
   super_Walker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>.replacep = replacement;
  ppEVar1 = SmallVector<wasm::Expression_*,_10UL>::back
                      (&(this->
                        super_ExpressionStackWalker<Fixer,_wasm::UnifiedExpressionVisitor<Fixer,_void>_>
                        ).expressionStack);
  *ppEVar1 = replacement;
  return;
}

Assistant:

void replace() { replaceCurrent(parent.makeTrivial(getCurrent()->type)); }